

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemTaskTests.cpp
# Opt level: O3

int __thiscall
anon_unknown.dwarf_4799b::LoggingFileSystem::remove(LoggingFileSystem *this,char *__filename)

{
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar1;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->deletedPathsMutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->deletedPaths,(value_type *)__filename);
  uVar1 = extraout_RAX;
  if (local_28._M_owns == true) {
    std::unique_lock<std::mutex>::unlock(&local_28);
    uVar1 = extraout_RAX_00;
  }
  return (int)CONCAT71((int7)((ulong)uVar1 >> 8),1);
}

Assistant:

virtual bool remove(const std::string& path) override {
    std::unique_lock<std::mutex> lock(deletedPathsMutex);
    deletedPaths.push_back(path);
    return true;
  }